

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::FileMetaData::FileMetaData(FileMetaData *this,FileMetaData *other243)

{
  *(undefined ***)this = &PTR__FileMetaData_024c1080;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->created_by)._M_dataplus._M_p = (pointer)&(this->created_by).field_2;
  (this->created_by)._M_string_length = 0;
  (this->created_by).field_2._M_local_buf[0] = '\0';
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EncryptionAlgorithm::EncryptionAlgorithm(&this->encryption_algorithm);
  (this->footer_signing_key_metadata)._M_dataplus._M_p =
       (pointer)&(this->footer_signing_key_metadata).field_2;
  (this->footer_signing_key_metadata)._M_string_length = 0;
  (this->footer_signing_key_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_FileMetaData__isset)((byte)this->__isset & 0xe0);
  this->version = other243->version;
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  operator=(&(this->schema).
             super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
            ,&(other243->schema).
              super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           );
  this->num_rows = other243->num_rows;
  std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::operator=
            (&(this->row_groups).
              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>,
             &(other243->row_groups).
              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>);
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::operator=
            (&(this->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
             &(other243->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>);
  std::__cxx11::string::_M_assign((string *)&this->created_by);
  std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::operator=
            (&(this->column_orders).
              super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
             ,&(other243->column_orders).
               super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
            );
  EncryptionAlgorithm::operator=(&this->encryption_algorithm,&other243->encryption_algorithm);
  std::__cxx11::string::_M_assign((string *)&this->footer_signing_key_metadata);
  this->__isset = other243->__isset;
  return;
}

Assistant:

FileMetaData::FileMetaData(const FileMetaData& other243) {
  version = other243.version;
  schema = other243.schema;
  num_rows = other243.num_rows;
  row_groups = other243.row_groups;
  key_value_metadata = other243.key_value_metadata;
  created_by = other243.created_by;
  column_orders = other243.column_orders;
  encryption_algorithm = other243.encryption_algorithm;
  footer_signing_key_metadata = other243.footer_signing_key_metadata;
  __isset = other243.__isset;
}